

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_switch_Dyy_unconditional_opt
               (response_layer *layer,integral_image *iimage)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  integral_image *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  integral_image *in_stack_000000a8;
  response_layer *in_stack_000000b0;
  undefined8 uStack_180;
  float local_178 [4];
  float local_168;
  int local_164;
  long local_160;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  int local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  int local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  int local_120;
  int local_11c;
  ulong local_118;
  unsigned_long __vla_expr0;
  int local_104;
  int local_100;
  int y;
  int x;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int j;
  int i;
  int k0;
  int k;
  int ind;
  bool *laplacian;
  float *response;
  int c01;
  int c00;
  int r01;
  int r00;
  int c11;
  int c10;
  int r11;
  int r10;
  float D1;
  float D0;
  float C1;
  float C0;
  float B1;
  float B0;
  float A1;
  float A0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  float Dxy;
  float Dyy;
  float Dxx;
  float inv_area;
  int lobe;
  int border;
  int filter_size;
  int step;
  float *data;
  uint local_28;
  int iheight;
  int iwidth;
  int data_width;
  int width;
  int height;
  integral_image *iimage_local;
  response_layer *layer_local;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  __vla_expr0 = (unsigned_long)local_178;
  data_width = layer->height;
  iwidth = layer->width;
  iheight = iimage->data_width;
  local_28 = iimage->width;
  data._4_4_ = iimage->height;
  _filter_size = iimage->data;
  border = layer->step;
  lobe = layer->filter_size;
  inv_area = (float)((lobe + -1) / 2);
  Dxx = (float)(lobe / 3);
  Dyy = 1.0 / (float)(lobe * lobe);
  laplacian = (bool *)layer->response;
  _k = layer->laplacian;
  k0 = 0;
  local_100 = 0;
  local_104 = 0;
  _width = iimage;
  iimage_local = (integral_image *)layer;
  if (data._4_4_ < lobe) {
    if ((int)inv_area < data._4_4_) {
      if ((int)Dxx * 2 + -1 < (int)local_28) {
        uStack_180 = 0x124c78;
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
      }
      else {
        uStack_180 = 0x124c87;
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
      }
    }
    else if ((int)Dxx < (int)local_28) {
      local_118 = (ulong)local_28;
      lVar2 = -(local_118 * 4 + 0xf & 0xfffffffffffffff0);
      local_160 = (long)local_178 + lVar2;
      for (t0 = 0; t0 < iwidth * border - (int)Dxx; t0 = border + t0) {
        *(float *)(local_160 + (long)t0 * 4) =
             _filter_size[(data._4_4_ + -1) * iheight + t0 + (int)Dxx + -1];
      }
      A1 = _filter_size[(int)((data._4_4_ + -1) * iheight + (local_28 - 1))];
      for (; t0 < (int)Dxx; t0 = border + t0) {
        *(float *)(local_160 + (long)t0 * 4) = A1;
      }
      for (; t0 < iwidth * border; t0 = border + t0) {
        A0 = _filter_size[(data._4_4_ + -1) * iheight + (t0 - (int)Dxx)];
        *(float *)(local_160 + (long)t0 * 4) = A1 - A0;
      }
      for (local_100 = 0; local_100 < data_width * border; local_100 = border + local_100) {
        t2 = local_100 - (int)Dxx;
        t3 = local_100 + (int)Dxx + -1;
        t4 = (int)Dxx / 2 + 1;
        t5 = local_100 + -1;
        t7 = (local_100 - (int)Dxx) + -1;
        t9 = local_100 + (int)Dxx;
        local_164 = local_100;
        y = (local_100 - (int)Dxx / 2) + -1;
        for (local_104 = 0; piVar4 = _width, iVar3 = y, local_104 < iwidth * border;
            local_104 = border + local_104) {
          t6 = local_104 + -1;
          iVar5 = local_104 - (int)Dxx;
          t8 = iVar5 + -1;
          x = local_104 + (int)Dxx;
          local_178[0] = *(float *)(local_160 + (long)local_104 * 4);
          iVar6 = y + (int)Dxx;
          iVar7 = x + -2;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125985;
          auVar12._0_4_ = box_integral_unconditional_opt(piVar4,iVar3,iVar5,iVar6,iVar7);
          piVar4 = _width;
          iVar5 = t2;
          iVar3 = t3;
          auVar12._4_60_ = extraout_var_02;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar12._0_16_,
                                   ZEXT416((uint)local_178[0]));
          Dyy0 = auVar1._0_4_;
          iVar6 = local_104 - (int)inv_area;
          iVar7 = local_104 + (int)inv_area;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x1259cf;
          local_178[1] = box_integral_unconditional_opt(piVar4,iVar5,iVar6 + -1,iVar3,iVar7);
          piVar4 = _width;
          iVar5 = t2;
          iVar3 = t3;
          iVar6 = local_104 - t4;
          iVar7 = x - t4;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125a06;
          auVar13._0_4_ = box_integral_unconditional_opt(piVar4,iVar5,iVar6,iVar3,iVar7);
          piVar4 = _width;
          iVar7 = t5;
          iVar6 = t7;
          iVar5 = x;
          iVar3 = local_104;
          auVar13._4_60_ = extraout_var_03;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar13._0_16_,
                                   ZEXT416((uint)local_178[1]));
          Dxy = auVar1._0_4_;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125a46;
          local_178[2] = box_integral_unconditional_opt(piVar4,iVar6,iVar3,iVar7,iVar5);
          piVar4 = _width;
          iVar7 = t6;
          iVar6 = t8;
          iVar5 = t9;
          iVar3 = local_100;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125a70;
          local_178[3] = box_integral_unconditional_opt(piVar4,iVar3,iVar6,iVar5,iVar7);
          piVar4 = _width;
          iVar7 = t5;
          iVar6 = t6;
          iVar5 = t7;
          iVar3 = t8;
          local_178[3] = local_178[2] + local_178[3];
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125aaa;
          local_168 = box_integral_unconditional_opt(piVar4,iVar5,iVar3,iVar7,iVar6);
          piVar4 = _width;
          iVar7 = t9;
          iVar6 = x;
          iVar5 = local_100;
          iVar3 = local_104;
          local_168 = local_178[3] - local_168;
          *(undefined8 *)((long)&uStack_180 + lVar2) = 0x125ae4;
          fVar8 = box_integral_unconditional_opt(piVar4,iVar5,iVar3,iVar7,iVar6);
          Dyy0 = Dyy * Dyy0;
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_168 - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
    }
    else {
      r10 = (int)_filter_size[(int)((data._4_4_ + -1) * iheight + (local_28 - 1))];
      for (local_100 = 0; local_11c = local_100, local_100 < iwidth * border - (int)Dxx / 2;
          local_100 = border + local_100) {
        local_120 = local_100;
        c10 = (local_100 - (int)Dxx / 2) + -1;
        c11 = c10 + (int)Dxx;
        r11 = (int)_filter_size[(int)(c11 * iheight + (local_28 - 1))];
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)r11),
                                 ZEXT416((uint)r10));
        Dyy0 = Dyy * auVar1._0_4_;
        t2 = local_100 - (int)Dxx;
        t3 = local_100 + (int)Dxx + -1;
        t4 = (int)Dxx / 2 + 1;
        t5 = local_100 + -1;
        t7 = (local_100 - (int)Dxx) + -1;
        t9 = local_100 + (int)Dxx;
        for (local_104 = 0; local_104 < iwidth * border; local_104 = border + local_104) {
          t6 = local_104 + -1;
          t8 = (local_104 - (int)Dxx) + -1;
          x = local_104 + (int)Dxx;
          uStack_180 = 0x124e68;
          local_130 = box_integral_unconditional_opt
                                (_width,t2,(local_104 - (int)inv_area) + -1,t3,
                                 local_104 + (int)inv_area);
          uStack_180 = 0x124e9f;
          auVar9._0_4_ = box_integral_unconditional_opt(_width,t2,local_104 - t4,t3,x - t4);
          auVar9._4_60_ = extraout_var;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar9._0_16_,
                                   ZEXT416((uint)local_130));
          Dxy = auVar1._0_4_;
          uStack_180 = 0x124edf;
          local_12c = box_integral_unconditional_opt(_width,t7,local_104,t5,x);
          uStack_180 = 0x124f09;
          local_128 = box_integral_unconditional_opt(_width,local_100,t8,t9,t6);
          local_128 = local_12c + local_128;
          uStack_180 = 0x124f43;
          local_124 = box_integral_unconditional_opt(_width,t7,t8,t5,t6);
          local_124 = local_128 - local_124;
          uStack_180 = 0x124f7d;
          fVar8 = box_integral_unconditional_opt(_width,local_100,local_104,t9,x);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_124 - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
      Dyy0 = Dyy * (float)r10 * -2.0;
      for (; local_134 = local_100, local_100 < (int)Dxx / 2 + 1; local_100 = border + local_100) {
        t2 = local_100 - (int)Dxx;
        t3 = local_100 + (int)Dxx + -1;
        t4 = (int)Dxx / 2 + 1;
        t5 = local_100 + -1;
        t7 = (local_100 - (int)Dxx) + -1;
        t9 = local_100 + (int)Dxx;
        for (local_104 = 0; local_104 < iwidth * border; local_104 = border + local_104) {
          t6 = local_104 + -1;
          t8 = (local_104 - (int)Dxx) + -1;
          x = local_104 + (int)Dxx;
          uStack_180 = 0x125181;
          local_144 = box_integral_unconditional_opt
                                (_width,t2,(local_104 - (int)inv_area) + -1,t3,
                                 local_104 + (int)inv_area);
          uStack_180 = 0x1251b8;
          auVar10._0_4_ = box_integral_unconditional_opt(_width,t2,local_104 - t4,t3,x - t4);
          auVar10._4_60_ = extraout_var_00;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar10._0_16_,
                                   ZEXT416((uint)local_144));
          Dxy = auVar1._0_4_;
          uStack_180 = 0x1251f8;
          local_140 = box_integral_unconditional_opt(_width,t7,local_104,t5,x);
          uStack_180 = 0x125222;
          local_13c = box_integral_unconditional_opt(_width,local_100,t8,t9,t6);
          local_13c = local_140 + local_13c;
          uStack_180 = 0x12525c;
          local_138 = box_integral_unconditional_opt(_width,t7,t8,t5,t6);
          local_138 = local_13c - local_138;
          uStack_180 = 0x125296;
          fVar8 = box_integral_unconditional_opt(_width,local_100,local_104,t9,x);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_138 - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
      for (; local_100 < data_width * border; local_100 = border + local_100) {
        local_148 = local_100;
        c10 = (local_100 - (int)Dxx / 2) + -1;
        D = _filter_size[(int)(c10 * iheight + (local_28 - 1))];
        auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)D),
                                 ZEXT416((uint)-((float)r10 * 2.0)));
        Dyy0 = Dyy * auVar1._0_4_;
        t2 = local_100 - (int)Dxx;
        t3 = local_100 + (int)Dxx + -1;
        t4 = (int)Dxx / 2 + 1;
        t5 = local_100 + -1;
        t7 = (local_100 - (int)Dxx) + -1;
        t9 = local_100 + (int)Dxx;
        for (local_104 = 0; local_104 < iwidth * border; local_104 = border + local_104) {
          t6 = local_104 + -1;
          t8 = (local_104 - (int)Dxx) + -1;
          x = local_104 + (int)Dxx;
          uStack_180 = 0x1254f3;
          local_158 = box_integral_unconditional_opt
                                (_width,t2,(local_104 - (int)inv_area) + -1,t3,
                                 local_104 + (int)inv_area);
          uStack_180 = 0x12552a;
          auVar11._0_4_ = box_integral_unconditional_opt(_width,t2,local_104 - t4,t3,x - t4);
          auVar11._4_60_ = extraout_var_01;
          auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar11._0_16_,
                                   ZEXT416((uint)local_158));
          Dxy = auVar1._0_4_;
          uStack_180 = 0x12556a;
          local_154 = box_integral_unconditional_opt(_width,t7,local_104,t5,x);
          uStack_180 = 0x125594;
          local_150 = box_integral_unconditional_opt(_width,local_100,t8,t9,t6);
          local_150 = local_154 + local_150;
          uStack_180 = 0x1255ce;
          local_14c = box_integral_unconditional_opt(_width,t7,t8,t5,t6);
          local_14c = local_150 - local_14c;
          uStack_180 = 0x125608;
          fVar8 = box_integral_unconditional_opt(_width,local_100,local_104,t9,x);
          Dxy = Dyy * Dxy;
          Dyy1 = Dyy * (local_14c - fVar8);
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                                   ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
          *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
          _k[k0] = 0.0 <= Dxy + Dyy0;
          k0 = k0 + 1;
        }
      }
    }
  }
  else {
    uStack_180 = 0x124c4f;
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_000000b0,in_stack_000000a8);
  }
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional

        optimization:
        - box_integral_unconditional_opt instead of box_integral_unconditional
        - scalar replacement for more optimal flops count
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width*step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;
                    t9 = x - lobe / 2 - 1;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}